

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O1

void __thiscall DElevator::Tick(DElevator *this)

{
  double dVar1;
  int direction;
  sector_t_conflict *this_00;
  EMoveResult EVar2;
  
  this_00 = (this->super_DMover).super_DSectorEffect.m_Sector;
  direction = this->m_Direction;
  if (direction < 0) {
    dVar1 = (this_00->floorplane).D;
    EVar2 = sector_t::MoveFloor((sector_t *)this_00,this->m_Speed,this->m_FloorDestDist,-1,direction
                                ,false);
    if ((EVar2 & ~pastdest) != ok) goto LAB_003f764b;
    EVar2 = sector_t::MoveCeiling
                      ((sector_t *)(this->super_DMover).super_DSectorEffect.m_Sector,this->m_Speed,
                       this->m_CeilingDestDist,-1,this->m_Direction,false);
    if (EVar2 != crushed) goto LAB_003f764b;
    sector_t::MoveFloor((sector_t *)(this->super_DMover).super_DSectorEffect.m_Sector,this->m_Speed,
                        dVar1,-1,-this->m_Direction,false);
  }
  else {
    dVar1 = (this_00->ceilingplane).D;
    EVar2 = sector_t::MoveCeiling
                      ((sector_t *)this_00,this->m_Speed,this->m_CeilingDestDist,-1,direction,false)
    ;
    if ((EVar2 & ~pastdest) != ok) goto LAB_003f764b;
    EVar2 = sector_t::MoveFloor((sector_t *)(this->super_DMover).super_DSectorEffect.m_Sector,
                                this->m_Speed,this->m_FloorDestDist,-1,this->m_Direction,false);
    if (EVar2 != crushed) goto LAB_003f764b;
    sector_t::MoveCeiling
              ((sector_t *)(this->super_DMover).super_DSectorEffect.m_Sector,this->m_Speed,dVar1,-1,
               -this->m_Direction,false);
  }
  EVar2 = crushed;
LAB_003f764b:
  if (EVar2 == pastdest) {
    SN_StopSequence((sector_t *)(this->super_DMover).super_DSectorEffect.m_Sector,1);
    (((this->super_DMover).super_DSectorEffect.m_Sector)->floordata).field_0.p =
         (DSectorEffect *)0x0;
    (((this->super_DMover).super_DSectorEffect.m_Sector)->ceilingdata).field_0.p =
         (DSectorEffect *)0x0;
    (*(this->super_DMover).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject[4])(this);
    return;
  }
  return;
}

Assistant:

void DElevator::Tick ()
{
	EMoveResult res;

	double oldfloor, oldceiling;

	oldfloor = m_Sector->floorplane.fD();
	oldceiling = m_Sector->ceilingplane.fD();

	if (m_Direction < 0)	// moving down
	{
		res = m_Sector->MoveFloor (m_Speed, m_FloorDestDist, m_Direction);
		if (res == EMoveResult::ok || res == EMoveResult::pastdest)
		{
			res = m_Sector->MoveCeiling (m_Speed, m_CeilingDestDist, m_Direction);
			if (res == EMoveResult::crushed)
			{
				m_Sector->MoveFloor (m_Speed, oldfloor, -m_Direction);
			}
		}
	}
	else // up
	{
		res = m_Sector->MoveCeiling (m_Speed, m_CeilingDestDist, m_Direction);
		if (res == EMoveResult::ok || res == EMoveResult::pastdest)
		{
			res = m_Sector->MoveFloor (m_Speed, m_FloorDestDist, m_Direction);
			if (res == EMoveResult::crushed)
			{
				m_Sector->MoveCeiling (m_Speed, oldceiling, -m_Direction);
			}
		}
	}

	if (res == EMoveResult::pastdest)	// if destination height acheived
	{
		// make floor stop sound
		SN_StopSequence (m_Sector, CHAN_FLOOR);

		m_Sector->floordata = NULL;		//jff 2/22/98
		m_Sector->ceilingdata = NULL;	//jff 2/22/98
		Destroy ();		// remove elevator from actives
	}
}